

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O3

void concept_const_suite::random_access_iterator_subtraction_assignment(void)

{
  long lVar1;
  ulong uVar2;
  initializer_list<int> __l;
  const_iterator a;
  vector<int,_std::allocator<int>_> data;
  circular_view<int,_18446744073709551615UL> span;
  basic_iterator<const_int> local_68;
  undefined4 local_54;
  vector<int,_std::allocator<int>_> local_50;
  circular_view<int,_18446744073709551615UL> local_38;
  long local_18;
  
  local_38.member.data = (pointer)0x160000000b;
  local_38.member.cap = 0x2c00000021;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_38;
  std::vector<int,_std::allocator<int>_>::vector(&local_50,__l,(allocator_type *)&local_68);
  lVar1 = (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_38.member.data = (pointer)0x0;
  if (lVar1 != 0) {
    local_38.member.data =
         local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
  }
  local_38.member.cap = lVar1 >> 2;
  local_68.current = lVar1 >> 1;
  if ((local_68.current & local_68.current - 1) == 0) {
    local_68.current = local_68.current - 1 & local_38.member.cap;
  }
  else {
    local_68.current = local_38.member.cap % local_68.current;
  }
  local_68.parent = &local_38;
  local_38.member.size = local_38.member.cap;
  local_38.member.next = local_38.member.cap;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator-=
            (&local_68,2);
  uVar2 = local_38.member.cap * 2;
  if ((uVar2 & local_38.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_38.member.next - local_38.member.size;
  }
  else {
    uVar2 = (local_38.member.next - local_38.member.size) % uVar2;
  }
  if (local_68.parent != (circular_view<int,_18446744073709551615UL> *)0x0) {
    local_18 = local_68.current - uVar2;
    local_54 = 2;
    boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
              ("std::distance(span.begin(), a)","2",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
               ,0x1ef,"void concept_const_suite::random_access_iterator_subtraction_assignment()",
               &local_18,&local_54);
    if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  __assert_fail("parent",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                ,0x398,
                "difference_type vista::circular_view<int>::basic_iterator<const int>::operator-(const iterator_type &) const [T = int, Extent = 18446744073709551615, U = const int]"
               );
}

Assistant:

void random_access_iterator_subtraction_assignment()
{
    // r -= n
    std::vector<int> data = { 11, 22, 33, 44 };
    const circular_view<int> span(data.begin(), data.end(), data.begin(), data.size());
    circular_view<int>::const_iterator a = span.end();
    a -= 2;
    BOOST_TEST_EQ(std::distance(span.begin(), a), 2);
}